

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::NewMessage(FlowBuffer *this)

{
  int iVar1;
  long in_RDI;
  FlowBuffer *unaff_retaddr;
  int bytes_to_advance;
  int local_c;
  
  local_c = 0;
  if ((*(int *)(in_RDI + 8) == 0) && (iVar1 = *(int *)(in_RDI + 0x44), iVar1 != 0)) {
    if (iVar1 == 1) {
      local_c = 1;
      if (*(int *)(in_RDI + 0x38) == 1) {
        local_c = 2;
      }
      local_c = *(int *)(in_RDI + 0x1c) + local_c;
    }
    else if (iVar1 == 2) {
      local_c = *(int *)(in_RDI + 0x1c);
    }
  }
  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + (long)local_c;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined1 *)(in_RDI + 0x18) = 0;
  ContractBuffer(unaff_retaddr);
  return;
}

Assistant:

void FlowBuffer::NewMessage()
	{
	BINPAC_ASSERT(frame_length_ >= 0);

	int bytes_to_advance = 0;
	if ( buffer_n_ == 0 )
		{
		switch ( mode_ )
			{
			case LINE_MODE:
				bytes_to_advance = (frame_length_ + (linebreak_style_ == STRICT_CRLF ? 2 : 1));
				break;
			case FRAME_MODE:
				bytes_to_advance = frame_length_;
				break;
			case UNKNOWN_MODE:
				break;
			}
		}

	orig_data_begin_ += bytes_to_advance;
	BINPAC_ASSERT(orig_data_begin_ <= orig_data_end_);

	buffer_n_ = 0;
	message_complete_ = false;
	ContractBuffer();
	}